

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correction.hpp
# Opt level: O1

void MGARD::compute_load_vector_coeff_row<float>
               (float *load_v_buffer,size_t n_nodal,size_t n_coeff,float h,float *nodal_buffer,
               float *coeff_buffer)

{
  size_t sVar1;
  
  *load_v_buffer =
       nodal_buffer[1] * 0.083333336 + *coeff_buffer * 0.5 + *nodal_buffer * 0.8333333 * 0.5;
  if (1 < n_coeff) {
    sVar1 = 1;
    do {
      load_v_buffer[sVar1] =
           nodal_buffer[sVar1] * 0.8333333 +
           (nodal_buffer[sVar1 - 1] + nodal_buffer[sVar1 + 1]) * 0.083333336 +
           (coeff_buffer[sVar1 - 1] + coeff_buffer[sVar1]) * 0.5;
      sVar1 = sVar1 + 1;
    } while (n_coeff != sVar1);
  }
  load_v_buffer[n_coeff] =
       nodal_buffer[n_coeff] * 0.8333333 * 0.5 +
       nodal_buffer[n_coeff - 1] * 0.083333336 + coeff_buffer[n_coeff - 1] * 0.5;
  if (n_coeff + 2 == n_nodal) {
    load_v_buffer[n_coeff + 1] = 0.0;
  }
  return;
}

Assistant:

void  compute_load_vector_coeff_row(T * load_v_buffer, size_t n_nodal, size_t n_coeff, T h, const T * nodal_buffer, const T * coeff_buffer){
    T const * coeff = coeff_buffer;
    T const * nodal = nodal_buffer;
    // T ah = alpha * h;   // 1/12
    // T bh = beta * h;    // 1/2
    // T ch = gamma * h;   // 5/6
    // eliminate h for efficiency
    T ah = alpha;   // 1/12
    T bh = beta;    // 1/2
    T ch = gamma;   // 5/6
    // // first nodal value
    load_v_buffer[0] = nodal[0] * ch / 2 + coeff[0] * bh + nodal[1] * ah;
    // iterate through nodal values
    for(int i=1; i<n_coeff; i++){
        load_v_buffer[i] = (nodal[i - 1] + nodal[i + 1]) * ah + (coeff[i - 1] + coeff[i]) * bh + nodal[i] * ch;
    }
    // last nodal value
    load_v_buffer[n_coeff] = nodal[n_coeff - 1] * ah + coeff[n_coeff - 1] * bh + nodal[n_coeff] * ch / 2;
    // if next n is even, load_v_buffer[n_nodal - 1] = 0
    if(n_nodal == n_coeff + 2) load_v_buffer[n_coeff + 1] = 0;
}